

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAnalyzeAggregates(NameContext *pNC,Expr *pExpr)

{
  undefined1 local_48 [8];
  Walker w;
  Expr *pExpr_local;
  NameContext *pNC_local;
  
  w.pParse = (Parse *)analyzeAggregate;
  w.xExprCallback = analyzeAggregatesInSelect;
  w.xSelectCallback = analyzeAggregatesInSelectEnd;
  w.xSelectCallback2._0_4_ = 0;
  w._32_8_ = pNC;
  w.u = (anon_union_8_11_9d6f43ba_for_u)pExpr;
  sqlite3WalkExpr((Walker *)local_48,pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggregates(NameContext *pNC, Expr *pExpr){
  Walker w;
  w.xExprCallback = analyzeAggregate;
  w.xSelectCallback = analyzeAggregatesInSelect;
  w.xSelectCallback2 = analyzeAggregatesInSelectEnd;
  w.walkerDepth = 0;
  w.u.pNC = pNC;
  assert( pNC->pSrcList!=0 );
  sqlite3WalkExpr(&w, pExpr);
}